

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::BuildVectorOfTableFromBytes
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  EnumDef ***pppEVar3;
  const_iterator cVar4;
  long *plVar5;
  size_t t;
  size_t t_00;
  size_type *psVar6;
  EnumDef **ppEVar7;
  long *plVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  Type vector_type;
  string field_method;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  string struct_type;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Type local_f0;
  key_type local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"nested_flatbuffer","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&(field->super_Definition).attributes,&local_d0);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    bVar9 = true;
  }
  else {
    bVar9 = *(long *)(cVar4._M_node + 2) == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    (*(this->namer_).super_Namer._vptr_Namer[4])(&local_d0,&this->namer_,field);
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_50,&this->namer_,struct_def);
    std::operator+(&local_110,"def ",&local_50);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    paVar1 = &local_130.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_130.field_2._M_allocated_capacity = *psVar6;
      local_130.field_2._8_8_ = plVar5[3];
      local_130._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar6;
      local_130._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_130._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,(ulong)local_d0._M_dataplus._M_p);
    pppEVar3 = (EnumDef ***)&local_f0.enum_def;
    ppEVar7 = (EnumDef **)(plVar5 + 2);
    if ((EnumDef **)*plVar5 == ppEVar7) {
      local_f0.enum_def = *ppEVar7;
      local_f0._24_8_ = plVar5[3];
      local_f0._0_8_ = pppEVar3;
    }
    else {
      local_f0.enum_def = *ppEVar7;
      local_f0._0_8_ = (EnumDef **)*plVar5;
    }
    local_f0.struct_def = (StructDef *)plVar5[1];
    *plVar5 = (long)ppEVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,local_f0._0_8_);
    if ((EnumDef ***)local_f0._0_8_ != pppEVar3) {
      operator_delete((void *)local_f0._0_8_,
                      (ulong)((long)&((local_f0.enum_def)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    local_f0._0_8_ = pppEVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,(anonymous_namespace)::Indent_abi_cxx11_,
               DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_f0);
    std::__cxx11::string::_M_append((char *)code_ptr,local_f0._0_8_);
    if ((EnumDef ***)local_f0._0_8_ != pppEVar3) {
      operator_delete((void *)local_f0._0_8_,
                      (ulong)((long)&((local_f0.enum_def)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
    local_f0.struct_def = (field->value).type.struct_def;
    local_f0.enum_def = (field->value).type.enum_def;
    local_f0.element = BASE_TYPE_NONE;
    local_f0.base_type = (field->value).type.element;
    local_f0.fixed_length = (field->value).type.fixed_length;
    t = InlineAlignment(&local_f0);
    t_00 = InlineSize(&local_f0);
    NumToString<unsigned_long>(&local_130,t_00);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    NumToString<unsigned_long>(&local_110,t);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x37a4bd);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_130.field_2._M_allocated_capacity = *psVar6;
      local_130.field_2._8_8_ = plVar5[3];
      local_130._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar6;
      local_130._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_130._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,(anonymous_namespace)::Indent_abi_cxx11_,
               DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,(anonymous_namespace)::Indent_abi_cxx11_,
               DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,(anonymous_namespace)::Indent_abi_cxx11_,
               DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((((this->super_BaseGenerator).parser_)->opts).one_file == false) {
      std::operator+(&local_110,"def Make",&local_d0);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_130.field_2._M_allocated_capacity = *psVar6;
        local_130.field_2._8_8_ = plVar5[3];
        local_130._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar6;
        local_130._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_130._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_130._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,(anonymous_namespace)::Indent_abi_cxx11_,
                 DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
      std::__cxx11::string::append((char *)local_b0);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_b0,(ulong)local_50._M_dataplus._M_p);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_80 = *plVar8;
        lStack_78 = plVar5[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar8;
        local_90 = (long *)*plVar5;
      }
      local_88 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_110.field_2._M_allocated_capacity = *psVar6;
        local_110.field_2._8_8_ = plVar5[3];
        local_110._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar6;
        local_110._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_110._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_130.field_2._M_allocated_capacity = *psVar6;
        local_130.field_2._8_8_ = plVar5[3];
        local_130._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar6;
        local_130._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_130._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_130._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void BuildVectorOfTableFromBytes(const StructDef &struct_def,
                                   const FieldDef &field,
                                   std::string *code_ptr) const {
    auto nested = field.attributes.Lookup("nested_flatbuffer");
    if (!nested) { return; }  // There is no nested flatbuffer.

    auto &code = *code_ptr;
    const std::string field_method = namer_.Method(field);
    const std::string struct_type = namer_.Type(struct_def);

    // Generate method with struct and field name.
    code += "def " + struct_type + "Make" + field_method;
    code += "VectorFromBytes(builder, bytes):\n";
    code += Indent + "builder.StartVector(";
    auto vector_type = field.value.type.VectorType();
    auto alignment = InlineAlignment(vector_type);
    auto elem_size = InlineSize(vector_type);
    code += NumToString(elem_size);
    code += ", len(bytes), " + NumToString(alignment);
    code += ")\n";
    code += Indent + "builder.head = builder.head - len(bytes)\n";
    code += Indent + "builder.Bytes[builder.head : builder.head + len(bytes)]";
    code += " = bytes\n";
    code += Indent + "return builder.EndVector()\n";

    if (!parser_.opts.one_file) {
      // Generate method without struct and field name.
      code += "def Make" + field_method + "VectorFromBytes(builder, bytes):\n";
      code += Indent + "return " + struct_type + "Make" + field_method +
              "VectorFromBytes(builder, bytes)\n";
    }
  }